

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

bool __thiscall
TCLAP::ValueArg<double>::processArg
          (ValueArg<double> *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  ulong uVar5;
  size_type sVar6;
  undefined8 uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  string value;
  string flag;
  char *in_stack_fffffffffffffdd8;
  Arg *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffdf0;
  Arg *in_stack_fffffffffffffdf8;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined1 local_1b0 [48];
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  ArgParseException *in_stack_fffffffffffffe90;
  undefined1 local_160 [79];
  undefined1 local_111;
  undefined1 local_110 [39];
  char local_e9;
  string *in_stack_ffffffffffffff18;
  ValueArg<double> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  CmdLineParseException *in_stack_ffffffffffffff30;
  undefined1 local_c0 [95];
  allocator<char> local_61;
  string local_60 [32];
  string local_40 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  uint *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (((*(byte *)(in_RDI + 0x14) & 1) == 0) || (bVar1 = Arg::ignoreRest(), !bVar1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,(long)(int)*local_18);
    bVar1 = Arg::_hasBlanks(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    if (bVar1) {
      local_1 = 0;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,(long)(int)*local_18);
      std::__cxx11::string::string(local_40,(string *)pvVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::allocator<char>::~allocator(&local_61);
      (**(code **)(*in_RDI + 0x50))(in_RDI,local_40,local_60);
      bVar2 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_40);
      if ((bVar2 & 1) == 0) {
        local_1 = 0;
      }
      else {
        if ((*(byte *)((long)in_RDI + 0x91) & 1) != 0) {
          if ((*(byte *)((long)in_RDI + 0xa1) & 1) == 0) {
            local_111 = 1;
            __a = (allocator<char> *)__cxa_allocate_exception(0x68);
            __s = &local_e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffe20,__s,__a);
            (**(code **)(*in_RDI + 0x38))(local_110);
            CmdLineParseException::CmdLineParseException
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (string *)in_stack_ffffffffffffff20);
            local_111 = 0;
            __cxa_throw(__a,&CmdLineParseException::typeinfo,
                        CmdLineParseException::~CmdLineParseException);
          }
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          (**(code **)(*in_RDI + 0x38))(local_c0);
          CmdLineParseException::CmdLineParseException
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     (string *)in_stack_ffffffffffffff20);
          __cxa_throw(this_00,&CmdLineParseException::typeinfo,
                      CmdLineParseException::~CmdLineParseException);
        }
        cVar3 = Arg::delimiter();
        if ((cVar3 != ' ') &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8), bVar1))
        {
          uVar7 = __cxa_allocate_exception(0x68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          (**(code **)(*in_RDI + 0x38))(local_160);
          ArgParseException::ArgParseException
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
          __cxa_throw(uVar7,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        if (bVar1) {
          *local_18 = *local_18 + 1;
          uVar5 = (ulong)*local_18;
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_20);
          if (sVar6 <= uVar5) {
            uVar7 = __cxa_allocate_exception(0x68);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10
                      );
            (**(code **)(*in_RDI + 0x38))(local_1b0);
            ArgParseException::ArgParseException
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80
                      );
            __cxa_throw(uVar7,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_20,(long)(int)*local_18);
          _extractValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        else {
          _extractValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        *(undefined1 *)((long)in_RDI + 0x91) = 1;
        Arg::_checkWithVisitor(in_stack_fffffffffffffde0);
        local_1 = 1;
      }
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ValueArg<T>::processArg(int *i, std::vector<std::string>& args)
{
    if ( _ignoreable && Arg::ignoreRest() )
		return false;

    if ( _hasBlanks( args[*i] ) )
		return false;

    std::string flag = args[*i];

    std::string value = "";
    trimFlag( flag, value );

    if ( argMatches( flag ) )
    {
        if ( _alreadySet )
		{
			if ( _xorSet )
				throw( CmdLineParseException(
				       "Mutually exclusive argument already set!", 
				                             toString()) );
			else
				throw( CmdLineParseException("Argument already set!", 
				                             toString()) );
		}

        if ( Arg::delimiter() != ' ' && value == "" )
			throw( ArgParseException( 
							"Couldn't find delimiter for this argument!",
                             toString() ) );

        if ( value == "" )
        {
            (*i)++;
            if ( static_cast<unsigned int>(*i) < args.size() ) 
				_extractValue( args[*i] );
            else
				throw( ArgParseException("Missing a value for this argument!",
                                                    toString() ) );
        }
        else
			_extractValue( value );
				
        _alreadySet = true;
        _checkWithVisitor();
        return true;
    }	
    else
		return false;
}